

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cube.hpp
# Opt level: O0

void kitty::print_cubes(vector<kitty::cube,_std::allocator<kitty::cube>_> *cubes,uint length,
                       ostream *os)

{
  bool bVar1;
  const_iterator __lhs;
  ostream *in_RDX;
  undefined4 in_ESI;
  ostream *in_RDI;
  cube *cube;
  const_iterator __end1;
  const_iterator __begin1;
  vector<kitty::cube,_std::allocator<kitty::cube>_> *__range1;
  vector<kitty::cube,_std::allocator<kitty::cube>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<const_kitty::cube_*,_std::vector<kitty::cube,_std::allocator<kitty::cube>_>_>
  local_28;
  undefined4 in_stack_fffffffffffffff0;
  
  local_28._M_current =
       (cube *)std::vector<kitty::cube,_std::allocator<kitty::cube>_>::begin
                         (in_stack_ffffffffffffffc8);
  __lhs = std::vector<kitty::cube,_std::allocator<kitty::cube>_>::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_kitty::cube_*,_std::vector<kitty::cube,_std::allocator<kitty::cube>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<const_kitty::cube_*,_std::vector<kitty::cube,_std::allocator<kitty::cube>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    in_stack_ffffffffffffffc8 =
         (vector<kitty::cube,_std::allocator<kitty::cube>_> *)
         __gnu_cxx::
         __normal_iterator<const_kitty::cube_*,_std::vector<kitty::cube,_std::allocator<kitty::cube>_>_>
         ::operator*(&local_28);
    kitty::cube::print((cube *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                       (uint)((ulong)in_RDX >> 0x20),in_RDI);
    std::operator<<(in_RDX,'\n');
    __gnu_cxx::
    __normal_iterator<const_kitty::cube_*,_std::vector<kitty::cube,_std::allocator<kitty::cube>_>_>
    ::operator++(&local_28);
  }
  std::ostream::operator<<(in_RDX,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

inline void print_cubes( const std::vector<cube>& cubes, unsigned length = 32u, std::ostream& os = std::cout )
{
  for ( const auto& cube : cubes )
  {
    cube.print( length, os );
    os << '\n';
  }

  os << std::flush;
}